

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLSetColorKeyFailedDuringLoadTexture_Test::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLSetColorKeyFailedDuringLoadTexture_Test
          (SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLSetColorKeyFailedDuringLoadTexture_Test
           *this)

{
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLSetColorKeyFailedDuringLoadTexture_Test
  *this_local;
  
  SDLGraphicsSystemWithCreatedWindowTests::SDLGraphicsSystemWithCreatedWindowTests
            (&this->super_SDLGraphicsSystemWithCreatedWindowTests);
  (this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.super_Test.
  _vptr_Test = (_func_int **)
               &
               PTR__SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLSetColorKeyFailedDuringLoadTexture_Test_005061b0
  ;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLSetColorKeyFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath))
        .WillOnce(Return(ByMove(makeSDLSurface(surfacePtr))));
    EXPECT_CALL(*sdlMock, mapRGB(Pointer(surfacePtr), 0, 255, 255))
        .WillOnce(Return(mapRGBResult));
    EXPECT_CALL(*sdlMock, setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult))
        .WillOnce(Return(failure));
    EXPECT_CALL(*ptrDeleterMock, surfaceDeleter(surfacePtr));
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}